

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

void * yang_read_deviate_unsupported(ly_ctx *ctx,lys_deviation *dev)

{
  lys_deviate *plVar1;
  lys_deviation *dev_local;
  ly_ctx *ctx_local;
  
  if (dev->deviate_size == '\0') {
    plVar1 = (lys_deviate *)calloc(1,0x48);
    dev->deviate = plVar1;
    if (dev->deviate == (lys_deviate *)0x0) {
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yang_read_deviate_unsupported"
            );
      ctx_local = (ly_ctx *)0x0;
    }
    else {
      dev->deviate[dev->deviate_size].mod = LY_DEVIATE_NO;
      dev->deviate_size = '\x01';
      ctx_local = (ly_ctx *)dev->deviate;
    }
  }
  else {
    ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
            "\"not-supported\" deviation cannot be combined with any other deviation.");
    ctx_local = (ly_ctx *)0x0;
  }
  return ctx_local;
}

Assistant:

void *
yang_read_deviate_unsupported(struct ly_ctx *ctx, struct lys_deviation *dev)
{
    if (dev->deviate_size) {
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "\"not-supported\" deviation cannot be combined with any other deviation.");
        return NULL;
    }
    dev->deviate = calloc(1, sizeof *dev->deviate);
    LY_CHECK_ERR_RETURN(!dev->deviate, LOGMEM(ctx), NULL);
    dev->deviate[dev->deviate_size].mod = LY_DEVIATE_NO;
    dev->deviate_size = 1;
    return dev->deviate;
}